

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O1

void __thiscall Reader::Reader(Reader *this,string *filename)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  char cVar3;
  long lVar4;
  invalid_argument *this_00;
  undefined1 *puVar5;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  zstr::ifstream::ifstream(&this->file);
  (this->linebuffer)._M_dataplus._M_p = (pointer)&(this->linebuffer).field_2;
  (this->linebuffer)._M_string_length = 0;
  (this->linebuffer).field_2._M_local_buf[0] = '\0';
  lVar4 = -0x90;
  do {
    puVar5 = &(this->sectiontokens)._M_t._M_impl.field_0x0 + lVar4;
    *(undefined4 *)
     ((long)&(this->processedtokens).
             super__Vector_base<ProcessedToken,_std::allocator<ProcessedToken>_>._M_impl.
             super__Vector_impl_data._M_start + lVar4) = 0;
    *(undefined1 **)
     ((long)&(this->processedtokens).
             super__Vector_base<ProcessedToken,_std::allocator<ProcessedToken>_>._M_impl.
             super__Vector_impl_data._M_finish + lVar4) = puVar5;
    *(undefined8 *)
     ((long)&(this->processedtokens).
             super__Vector_base<ProcessedToken,_std::allocator<ProcessedToken>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + lVar4) = 0;
    *puVar5 = 0;
    *(undefined8 *)
     ((long)&(this->sectiontokens)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent + lVar4) =
         0;
    lVar4 = lVar4 + 0x30;
  } while (lVar4 != 0);
  (this->processedtokens).super__Vector_base<ProcessedToken,_std::allocator<ProcessedToken>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->processedtokens).super__Vector_base<ProcessedToken,_std::allocator<ProcessedToken>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->processedtokens).super__Vector_base<ProcessedToken,_std::allocator<ProcessedToken>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->sectiontokens)._M_t._M_impl.super__Rb_tree_header;
  (this->sectiontokens)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->sectiontokens)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->sectiontokens)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->sectiontokens)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->sectiontokens)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->builder).variables._M_h._M_buckets = &(this->builder).variables._M_h._M_single_bucket;
  (this->builder).variables._M_h._M_bucket_count = 1;
  (this->builder).variables._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->builder).variables._M_h._M_element_count = 0;
  (this->builder).variables._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->builder).model.constraints.
  super__Vector_base<std::shared_ptr<Constraint>,_std::allocator<std::shared_ptr<Constraint>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->builder).model.constraints.
  super__Vector_base<std::shared_ptr<Constraint>,_std::allocator<std::shared_ptr<Constraint>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->builder).model.constraints.
  super__Vector_base<std::shared_ptr<Constraint>,_std::allocator<std::shared_ptr<Constraint>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->builder).model.variables.
  super__Vector_base<std::shared_ptr<Variable>,_std::allocator<std::shared_ptr<Variable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->builder).model.variables.
  super__Vector_base<std::shared_ptr<Variable>,_std::allocator<std::shared_ptr<Variable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->builder).model.variables.
  super__Vector_base<std::shared_ptr<Variable>,_std::allocator<std::shared_ptr<Variable>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->builder).model.soss.
  super__Vector_base<std::shared_ptr<SOS>,_std::allocator<std::shared_ptr<SOS>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->builder).model.soss.
  super__Vector_base<std::shared_ptr<SOS>,_std::allocator<std::shared_ptr<SOS>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->builder).model.soss.
  super__Vector_base<std::shared_ptr<SOS>,_std::allocator<std::shared_ptr<SOS>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->builder).variables._M_h._M_rehash_policy._M_next_resize = 0;
  (this->builder).variables._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->builder).model.objective.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->builder).model.objective.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pcVar2 = (filename->_M_dataplus)._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar2,pcVar2 + filename->_M_string_length);
  zstr::ifstream::open(&this->file,(char *)local_48,8);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"File not existent or illegal file format.");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Reader(std::string filename) {
#ifdef ZLIB_FOUND
    try {
      file.open(filename);
    } catch (const strict_fstream::Exception& e) {
    }
#else
    file.open(filename);
#endif
    lpassert(file.is_open());
  }